

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::BlendCase::~BlendCase(BlendCase *this)

{
  BlendCase *this_local;
  
  ~BlendCase(this);
  operator_delete(this,0x338);
  return;
}

Assistant:

BlendCase::~BlendCase (void)
{
	delete m_renderer;
	delete m_referenceRenderer;
	delete m_refColorBuffer;
}